

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

void proxy_negotiator_cleanup(ProxySocket *ps)

{
  ProxyNegotiator *pPVar1;
  
  pPVar1 = ps->pn;
  if (pPVar1 != (ProxyNegotiator *)0x0) {
    (*pPVar1->vt->free)(pPVar1);
    ps->pn = (ProxyNegotiator *)0x0;
  }
  if (ps->clientseat != (Seat *)0x0) {
    interactor_return_seat(ps->clientitr);
    ps->clientitr = (Interactor *)0x0;
    ps->clientseat = (Seat *)0x0;
  }
  return;
}

Assistant:

static void proxy_negotiator_cleanup(ProxySocket *ps)
{
    if (ps->pn) {
        proxy_negotiator_free(ps->pn);
        ps->pn = NULL;
    }
    if (ps->clientseat) {
        interactor_return_seat(ps->clientitr);
        ps->clientitr = NULL;
        ps->clientseat = NULL;
    }
}